

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O0

int __thiscall sc_core::sc_phash_base::remove(sc_phash_base *this,char *__filename)

{
  int iVar1;
  code *in_RDX;
  void *rc;
  void *rk;
  undefined8 local_28;
  uint local_4;
  
  iVar1 = remove(this,__filename);
  if (iVar1 != 0) {
    (*in_RDX)(local_28);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int
sc_phash_base::remove(const void* k, void (*kfree)(void*))
{
    void* rk;
    void* rc;
    if (remove(k, &rk, &rc)) {
        (*kfree)(rk);
        return 1;
    }
    else
        return 0;
}